

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_reflect_set(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val_00;
  JSValue v;
  JSAtom JVar1;
  int iVar2;
  int in_ECX;
  JSContext *in_RDI;
  int64_t *in_R8;
  JSAtom in_stack_0000001c;
  JSContext *in_stack_00000020;
  undefined1 in_stack_00000028 [16];
  JSAtom atom;
  int ret;
  JSValue receiver;
  JSValue val;
  JSValue prop;
  JSValue obj;
  JSAtom v_00;
  JSContext *local_b0;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int64_t iVar3;
  JSContext *local_90;
  JSValueUnion local_30;
  int64_t local_28;
  undefined4 uStack_c;
  
  iVar3 = *in_R8;
  v = *(JSValue *)(in_R8 + 4);
  local_90 = (JSContext *)in_R8[1];
  if (3 < in_ECX) {
    iVar3 = in_R8[6];
    local_90 = (JSContext *)in_R8[7];
  }
  if ((int)(JSContext *)in_R8[1] == -1) {
    val_00.u._4_4_ = in_stack_ffffffffffffff64;
    val_00.u.int32 = in_stack_ffffffffffffff60;
    val_00.tag = iVar3;
    JVar1 = JS_ValueToAtom(local_b0,val_00);
    v_00 = (JSAtom)((ulong)iVar3 >> 0x20);
    if (JVar1 == 0) {
      local_30.ptr = (void *)(local_30 << 0x20);
      local_28 = 6;
    }
    else {
      JS_DupValue(in_RDI,v);
      iVar2 = JS_SetPropertyGeneric
                        (in_stack_00000020,(JSValue)_atom,in_stack_0000001c,
                         (JSValue)in_stack_00000028,prop,obj.u.int32);
      JS_FreeAtom(local_90,v_00);
      if (iVar2 < 0) {
        local_30.ptr = (void *)(local_30 << 0x20);
        local_28 = 6;
      }
      else {
        local_30.int32._1_3_ = 0;
        local_30.int32._0_1_ = iVar2 != 0;
        local_30._4_4_ = uStack_c;
        local_28 = 1;
      }
    }
  }
  else {
    _local_30 = JS_ThrowTypeErrorNotAnObject((JSContext *)0x1bd18c);
  }
  return _local_30;
}

Assistant:

static JSValue js_reflect_set(JSContext *ctx, JSValueConst this_val,
                              int argc, JSValueConst *argv)
{
    JSValueConst obj, prop, val, receiver;
    int ret;
    JSAtom atom;

    obj = argv[0];
    prop = argv[1];
    val = argv[2];
    if (argc > 3)
        receiver = argv[3];
    else
        receiver = obj;
    if (JS_VALUE_GET_TAG(obj) != JS_TAG_OBJECT)
        return JS_ThrowTypeErrorNotAnObject(ctx);
    atom = JS_ValueToAtom(ctx, prop);
    if (unlikely(atom == JS_ATOM_NULL))
        return JS_EXCEPTION;
    ret = JS_SetPropertyGeneric(ctx, obj, atom,
                                JS_DupValue(ctx, val), receiver, 0);
    JS_FreeAtom(ctx, atom);
    if (ret < 0)
        return JS_EXCEPTION;
    else
        return JS_NewBool(ctx, ret);
}